

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

size_t divide_subset_split(size_t *ix_arr,double *x,size_t st,size_t end,double split_point)

{
  size_t sVar1;
  size_t st_orig;
  size_t sVar2;
  
  for (sVar2 = st; sVar2 <= end; sVar2 = sVar2 + 1) {
    if (*x <= split_point) {
      sVar1 = ix_arr[st];
      ix_arr[st] = ix_arr[sVar2];
      ix_arr[sVar2] = sVar1;
      st = st + 1;
    }
    x = x + 1;
  }
  return st;
}

Assistant:

size_t divide_subset_split(size_t ix_arr[], double x[], size_t st, size_t end, double split_point) noexcept
{
    size_t temp;
    size_t st_orig = st;
    for (size_t row = st_orig; row <= end; row++)
    {
        if (x[row - st_orig] <= split_point)
        {
            temp        = ix_arr[st];
            ix_arr[st]  = ix_arr[row];
            ix_arr[row] = temp;
            st++;
        }
    }
    return st;
}